

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W3CPropagator.h
# Opt level: O0

void __thiscall
jaegertracing::propagation::
W3CPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
::writeTraceParent(W3CPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
                   *this,ostream *out,SpanContext *ctx)

{
  _Setfill<char> _Var1;
  byte bVar2;
  _Setw _Var3;
  TraceID *traceID;
  ostream *poVar4;
  void *pvVar5;
  uint64_t uVar6;
  SpanContext *ctx_local;
  ostream *out_local;
  W3CPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  *this_local;
  
  std::operator<<(out,"00");
  std::operator<<(out,'-');
  traceID = SpanContext::traceID(ctx);
  writeTraceID(this,out,traceID);
  std::operator<<(out,'-');
  _Var3 = std::setw(0x10);
  poVar4 = std::operator<<(out,_Var3);
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(poVar4,_Var1._M_c);
  pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
  uVar6 = SpanContext::spanID(ctx);
  std::ostream::operator<<(pvVar5,uVar6);
  std::operator<<(out,'-');
  _Var3 = std::setw(2);
  poVar4 = std::operator<<(out,_Var3);
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(poVar4,_Var1._M_c);
  pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
  bVar2 = SpanContext::flags(ctx);
  std::ostream::operator<<(pvVar5,(ulong)bVar2);
  return;
}

Assistant:

void writeTraceParent(std::ostream& out, const SpanContext& ctx) const
    {
        out << "00";
        out << '-';
        writeTraceID(out, ctx.traceID());
        out << '-';
        out << std::setw(16) << std::setfill('0') << std::hex << ctx.spanID();
        out << '-';
        out << std::setw(2) << std::setfill('0') << std::hex
            << static_cast<size_t>(ctx.flags());
    }